

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  LocalGeneratorVector *this_00;
  reference this_01;
  pointer pcVar2;
  GeneratorTargetVector *this_02;
  reference this_03;
  pointer pcVar3;
  cmLocalGenerator *this_04;
  mapped_type *pmVar4;
  set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *this_05;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  byte local_109;
  cmStateSnapshot local_f8;
  _Base_ptr local_e0;
  undefined1 local_d8;
  cmGeneratorTarget *local_d0;
  reference local_c8;
  cmTargetDepend *tgtdep;
  iterator __end4;
  iterator __begin4;
  TargetDependSet *__range4;
  pointer local_98;
  mapped_type *local_90;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *targetSet;
  cmStateSnapshot tsnp;
  cmStateSnapshot csnp;
  cmLocalGenerator *tlg;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  std::
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&this->DirectoryTargetsMap);
  this_00 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(this_00);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&lg), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
              ::operator*(&__end1);
    pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (this_01);
    this_02 = cmLocalGenerator::GetGeneratorTargets(pcVar2);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(this_02);
    gt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
         std::
         vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
         ::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&gt), bVar1) {
      this_03 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                ::operator*(&__end2);
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_03);
      this_04 = cmGeneratorTarget::GetLocalGenerator(pcVar3);
      pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_03);
      bVar1 = cmGeneratorTarget::IsInBuildSystem(pcVar3);
      if (bVar1) {
        pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::get
                           (this_01);
        pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                           (this_03);
        bVar1 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)this,pcVar2,pcVar3);
        if (!bVar1) {
          pcVar2 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->(this_01);
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&tsnp.Position.Position,pcVar2);
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&targetSet,this_04);
          while( true ) {
            bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&tsnp.Position.Position);
            local_109 = 0;
            if (bVar1) {
              bVar1 = cmGlobalGenerator::IsExcluded
                                ((cmGlobalGenerator *)this,
                                 (cmStateSnapshot *)&tsnp.Position.Position,
                                 (cmStateSnapshot *)&targetSet);
              local_109 = bVar1 ^ 0xff;
            }
            if ((local_109 & 1) == 0) break;
            pmVar4 = std::
                     map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                     ::operator[](&this->DirectoryTargetsMap,(key_type *)&tsnp.Position.Position);
            local_90 = pmVar4;
            local_98 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       get(this_03);
            std::
            set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
            ::insert(pmVar4,&local_98);
            pcVar3 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     get(this_03);
            this_05 = &cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,pcVar3)->
                       super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
            ;
            __end4 = std::
                     set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     ::begin(this_05);
            tgtdep = (cmTargetDepend *)
                     std::
                     set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                     ::end(this_05);
            while (bVar1 = std::operator!=(&__end4,(_Self *)&tgtdep), bVar1) {
              local_c8 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&__end4);
              pmVar4 = local_90;
              local_d0 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(local_c8);
              pVar5 = std::
                      set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                      ::insert(pmVar4,&local_d0);
              local_e0 = (_Base_ptr)pVar5.first._M_node;
              local_d8 = pVar5.second;
              std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&__end4);
            }
            cmStateSnapshot::GetBuildsystemDirectoryParent
                      (&local_f8,(cmStateSnapshot *)&tsnp.Position.Position);
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (const auto& lg : this->LocalGenerators) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (!gt->IsInBuildSystem() || this->IsExcluded(lg.get(), gt.get())) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt.get());

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        for (cmTargetDepend const& tgtdep :
             this->GetTargetDirectDepends(gt.get())) {
          targetSet.insert(tgtdep);
        }
      }
    }
  }
}